

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O0

void __thiscall
phpconvert::StringHelper::regexReplace(StringHelper *this,string *target,string *from,string *to)

{
  match_flags mVar1;
  match_flag_type in_R9D;
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  regex re;
  string *to_local;
  string *from_local;
  string *target_local;
  StringHelper *this_local;
  
  re.m_pimpl.pn.pi_ = (sp_counted_base *)to;
  boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)local_38,
             from,0);
  std::__cxx11::string::string((string *)local_78,(string *)re.m_pimpl.pn.pi_);
  mVar1 = boost::regex_constants::operator|(format_default,format_all);
  boost::
  regex_replace<boost::regex_traits<char,boost::cpp_regex_traits<char>>,char,std::__cxx11::string>
            (&local_58,(boost *)target,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)mVar1,
             in_R9D);
  std::__cxx11::string::operator=((string *)target,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_78);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::~basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             local_38);
  return;
}

Assistant:

void StringHelper::regexReplace(string& target, string& from, string& to) {
	boost::regex re(from);
	target = boost::regex_replace(target, re, to,
			boost::match_default | boost::format_all);
}